

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O0

REF_STATUS ref_sort_unique_int(REF_INT n,REF_INT *original,REF_INT *nunique,REF_INT *unique)

{
  int local_30;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT j;
  REF_INT i;
  REF_INT *unique_local;
  REF_INT *nunique_local;
  REF_INT *original_local;
  REF_INT n_local;
  
  *nunique = -1;
  original_local._4_4_ = ref_sort_insertion_int(n,original,unique);
  if (original_local._4_4_ == 0) {
    local_30 = 0;
    for (ref_private_macro_code_rss = 1; ref_private_macro_code_rss < n;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (unique[local_30] != unique[ref_private_macro_code_rss]) {
        local_30 = local_30 + 1;
      }
      if (local_30 != ref_private_macro_code_rss) {
        unique[local_30] = unique[ref_private_macro_code_rss];
      }
    }
    *nunique = local_30 + 1;
    original_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",0xdb,
           "ref_sort_unique_int",(ulong)original_local._4_4_,"sort in unique");
  }
  return original_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_sort_unique_int(REF_INT n, REF_INT *original,
                                       REF_INT *nunique, REF_INT *unique) {
  REF_INT i, j;

  *nunique = REF_EMPTY;

  RSS(ref_sort_insertion_int(n, original, unique), "sort in unique");

  j = 0;
  for (i = 1; i < n; i++) {
    if (unique[j] != unique[i]) j++;
    if (j != i) unique[j] = unique[i];
  }

  *nunique = j + 1;

  return REF_SUCCESS;
}